

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TransformFeedback::PositionCase::PositionCase
          (PositionCase *this,Context *context,char *name,char *desc,deUint32 bufferType,
          deUint32 primitiveType)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TransformFeedbackCase).super_TestCase.m_context = context;
  (this->super_TransformFeedbackCase).m_progSpec.m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_varyings.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_varyings.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_varyings.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_bufferMode = bufferType;
  (this->super_TransformFeedbackCase).m_primitiveType = primitiveType;
  (this->super_TransformFeedbackCase).m_inputStride = 0;
  (this->super_TransformFeedbackCase).m_attributes.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_attributes.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_attributes.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_transformFeedbackOutputs.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_transformFeedbackOutputs.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_transformFeedbackOutputs.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_bufferStrides.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_bufferStrides.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_bufferStrides.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_program = (ShaderProgram *)0x0;
  (this->super_TransformFeedbackCase).m_transformFeedback = (TransformFeedback *)0x0;
  (this->super_TransformFeedbackCase).m_outputBuffers.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_outputBuffers.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_outputBuffers.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_iterNdx = 0;
  (this->super_TransformFeedbackCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TransformFeedbackCase_02187d80;
  ProgramSpec::addTransformFeedbackVarying
            (&(this->super_TransformFeedbackCase).m_progSpec,"gl_Position");
  return;
}

Assistant:

PositionCase (Context& context, const char* name, const char* desc, deUint32 bufferType, deUint32 primitiveType)
		: TransformFeedbackCase(context, name, desc, bufferType, primitiveType)
	{
		m_progSpec.addTransformFeedbackVarying("gl_Position");
	}